

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpAgent.h
# Opt level: O1

int __thiscall FileBodyHandler::handleSocket(FileBodyHandler *this,Socket *sock,int len)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  char buf [65536];
  undefined1 auStack_10038 [65544];
  
  iVar3 = 0;
  do {
    if (len == 0) {
      return iVar3;
    }
    iVar2 = 0x10000;
    if (len < 0x10000) {
      iVar2 = len;
    }
    uVar1 = (**(code **)(*(long *)sock + 0x18))(sock,auStack_10038,iVar2);
    if ((int)uVar1 < 0) {
      printf("ERROR READING = %d\n",(ulong)uVar1);
    }
    else {
      (**(code **)(*(long *)this->mFile + 0x18))(this->mFile,auStack_10038,(ulong)uVar1);
      len = len - uVar1;
      iVar3 = iVar3 + uVar1;
    }
  } while (-1 < (int)uVar1);
  return iVar3;
}

Assistant:

int handleSocket( JetHead::Socket &sock, int len )
	{
		char buf[TEST_BUFFER_SIZE];
		int total_read = 0;
		
		while (len)
		{
			int read = 0;
			int attempt_read = TEST_BUFFER_SIZE;

			if (len < TEST_BUFFER_SIZE)
				attempt_read = len;

			read = sock.read(buf, attempt_read);

			if (read < 0)
			{
				printf("ERROR READING = %d\n", read);
				break;
			}

			mFile.write( buf, read );

			len -= read;
			total_read += read;
		}
		
		return total_read;
	}